

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

PtrListIterator *
raviX_ptrlist_reverse_iterator(PtrListIterator *__return_storage_ptr__,PtrList *head)

{
  PtrList *pPVar1;
  int iVar2;
  
  if (head == (PtrList *)0x0) {
    __return_storage_ptr__->__head = (PtrList *)0x0;
    __return_storage_ptr__->__list = (PtrList *)0x0;
  }
  else {
    pPVar1 = head->prev_;
    __return_storage_ptr__->__list = pPVar1;
    __return_storage_ptr__->__head = pPVar1;
    if (pPVar1 != (PtrList *)0x0) {
      iVar2 = (int)*(char *)pPVar1;
      goto LAB_0010b7b7;
    }
  }
  iVar2 = 0;
LAB_0010b7b7:
  __return_storage_ptr__->__nr = iVar2;
  return __return_storage_ptr__;
}

Assistant:

PtrListIterator raviX_ptrlist_reverse_iterator(PtrList *head)
{
	PtrListIterator iter;
	iter.__head = iter.__list = head ? head->prev_ : NULL;
	iter.__nr = iter.__head ? iter.__head->nr_ : 0;
	return iter;
}